

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.h
# Opt level: O0

void __thiscall BuildStatus::SlidingRateInfo::UpdateRate(SlidingRateInfo *this,int update_hint)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 auVar4 [16];
  double local_20;
  int local_14;
  SlidingRateInfo *pSStack_10;
  int update_hint_local;
  SlidingRateInfo *this_local;
  
  if (update_hint != this->last_update_) {
    this->last_update_ = update_hint;
    local_14 = update_hint;
    pSStack_10 = this;
    sVar2 = std::queue<double,_std::deque<double,_std::allocator<double>_>_>::size(&this->times_);
    if (sVar2 == this->N) {
      std::queue<double,_std::deque<double,_std::allocator<double>_>_>::pop(&this->times_);
    }
    local_20 = Stopwatch::Elapsed(&this->stopwatch_);
    std::queue<double,_std::deque<double,_std::allocator<double>_>_>::push(&this->times_,&local_20);
    pvVar3 = std::queue<double,_std::deque<double,_std::allocator<double>_>_>::back(&this->times_);
    dVar1 = *pvVar3;
    pvVar3 = std::queue<double,_std::deque<double,_std::allocator<double>_>_>::front(&this->times_);
    if ((dVar1 != *pvVar3) || (NAN(dVar1) || NAN(*pvVar3))) {
      sVar2 = std::queue<double,_std::deque<double,_std::allocator<double>_>_>::size(&this->times_);
      auVar4._8_4_ = (int)(sVar2 >> 0x20);
      auVar4._0_8_ = sVar2;
      auVar4._12_4_ = 0x45300000;
      pvVar3 = std::queue<double,_std::deque<double,_std::allocator<double>_>_>::back(&this->times_)
      ;
      dVar1 = *pvVar3;
      pvVar3 = std::queue<double,_std::deque<double,_std::allocator<double>_>_>::front
                         (&this->times_);
      this->rate_ = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                    (dVar1 - *pvVar3);
    }
  }
  return;
}

Assistant:

void UpdateRate(int update_hint) {
      if (update_hint == last_update_)
        return;
      last_update_ = update_hint;

      if (times_.size() == N)
        times_.pop();
      times_.push(stopwatch_.Elapsed());
      if (times_.back() != times_.front())
        rate_ = times_.size() / (times_.back() - times_.front());
    }